

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O0

char * dfdToStringVendorID(khr_df_vendorid_e value)

{
  khr_df_vendorid_e value_local;
  char *local_8;
  
  if (value == KHR_DF_VENDORID_KHRONOS) {
    local_8 = "KHR_DF_VENDORID_KHRONOS";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* dfdToStringVendorID(khr_df_vendorid_e value) {
    switch (value) {
    case KHR_DF_VENDORID_KHRONOS:
        return "KHR_DF_VENDORID_KHRONOS";

    case KHR_DF_VENDORID_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}